

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinary
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  Descriptor *in_RCX;
  int i;
  FieldDescriptor *in_stack_00000168;
  Printer *in_stack_00000170;
  GeneratorOptions *in_stack_00000178;
  Generator *in_stack_00000180;
  Descriptor *in_stack_ffffffffffffff70;
  GeneratorOptions *in_stack_ffffffffffffff78;
  Printer *in_stack_ffffffffffffff80;
  GeneratorOptions *in_stack_ffffffffffffff88;
  Printer *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  Printer *in_stack_ffffffffffffffa0;
  int local_50;
  string local_40 [32];
  Descriptor *local_20;
  
  local_20 = in_RCX;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  io::Printer::Print<char[6],std::__cxx11::string>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             &in_stack_ffffffffffffff80->variable_delimiter_,&in_stack_ffffffffffffff78->output_dir)
  ;
  std::__cxx11::string::~string(local_40);
  for (local_50 = 0; iVar2 = Descriptor::field_count(local_20), local_50 < iVar2;
      local_50 = local_50 + 1) {
    Descriptor::field(local_20,local_50);
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)0x4669dc);
    if (!bVar1) {
      Descriptor::field(local_20,local_50);
      GenerateClassSerializeBinaryField
                (in_stack_00000180,in_stack_00000178,in_stack_00000170,in_stack_00000168);
    }
  }
  bVar1 = anon_unknown_0::IsExtendable((Descriptor *)0x466a72);
  if (bVar1) {
    Descriptor::file(local_20);
    (anonymous_namespace)::JSExtensionsObjectName_abi_cxx11_
              (in_stack_ffffffffffffff88,(FileDescriptor *)in_stack_ffffffffffffff80,
               (Descriptor *)in_stack_ffffffffffffff78);
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    io::Printer::Print<char[7],std::__cxx11::string,char[6],std::__cxx11::string>
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
               &in_stack_ffffffffffffff90->variable_delimiter_,
               &in_stack_ffffffffffffff88->output_dir,
               &in_stack_ffffffffffffff80->variable_delimiter_,
               &in_stack_ffffffffffffff78->output_dir);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff90);
  }
  io::Printer::Print<>(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinary(const GeneratorOptions& options,
                                             io::Printer* printer,
                                             const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Serializes the message to binary data (in protobuf wire format).\n"
      " * @return {!Uint8Array}\n"
      " */\n"
      "$class$.prototype.serializeBinary = function() {\n"
      "  var writer = new jspb.BinaryWriter();\n"
      "  $class$.serializeBinaryToWriter(this, writer);\n"
      "  return writer.getResultBuffer();\n"
      "};\n"
      "\n"
      "\n"
      "/**\n"
      " * Serializes the given message to binary data (in protobuf wire\n"
      " * format), writing to the given BinaryWriter.\n"
      " * @param {!$class$} message\n"
      " * @param {!jspb.BinaryWriter} writer\n"
      " * @suppress {unusedLocalVariables} f is only used for nested messages\n"
      " */\n"
      "$class$.serializeBinaryToWriter = function(message, "
      "writer) {\n"
      "  var f = undefined;\n",
      "class", GetMessagePath(options, desc));

  for (int i = 0; i < desc->field_count(); i++) {
    if (!IgnoreField(desc->field(i))) {
      GenerateClassSerializeBinaryField(options, printer, desc->field(i));
    }
  }

  if (IsExtendable(desc)) {
    printer->Print(
        "  jspb.Message.serializeBinaryExtensions(message, writer,\n"
        "    $extobj$Binary, $class$.prototype.getExtension);\n",
        "extobj", JSExtensionsObjectName(options, desc->file(), desc), "class",
        GetMessagePath(options, desc));
  }

  printer->Print(
      "};\n"
      "\n"
      "\n");
}